

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

bool __thiscall CLI::App::_valid_subcommand(App *this,string *current)

{
  pointer puVar1;
  App *this_00;
  pointer pcVar2;
  bool bVar3;
  pointer puVar4;
  string local_50;
  
  while ((this->require_subcommand_max_ != 0 &&
         (this->require_subcommand_max_ <=
          (ulong)((long)(this->parsed_subcommands_).
                        super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->parsed_subcommands_).
                        super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3)))) {
    this = this->parent_;
    if (this == (App *)0x0) {
      return false;
    }
  }
  puVar4 = (this->subcommands_).
           super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->subcommands_).
           super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 != puVar1) {
    do {
      this_00 = (puVar4->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
                super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar2 = (current->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + current->_M_string_length);
      bVar3 = check_name(this_00,&local_50);
      if (bVar3) {
        bVar3 = ((puVar4->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t
                 .super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                 super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl)->parsed_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (bVar3 == false) {
          return true;
        }
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar1);
  }
  if (this->parent_ == (App *)0x0) {
    return false;
  }
  bVar3 = _valid_subcommand(this->parent_,current);
  return bVar3;
}

Assistant:

bool _valid_subcommand(const std::string &current) const {
        // Don't match if max has been reached - but still check parents
        if(require_subcommand_max_ != 0 && parsed_subcommands_.size() >= require_subcommand_max_) {
            return parent_ != nullptr && parent_->_valid_subcommand(current);
        }

        for(const App_p &com : subcommands_)
            if(com->check_name(current) && !*com)
                return true;

        // Check parent if exists, else return false
        return parent_ != nullptr && parent_->_valid_subcommand(current);
    }